

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::BVHAggregate::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,BVHAggregate *this,Ray *ray,
          Float tMax)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  ulong uVar9;
  LinearBVHNode *pLVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  int nodesToVisit [64];
  float local_2ec;
  long local_2e0;
  undefined8 local_2d8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_268;
  uint local_260;
  undefined1 local_258 [16];
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_240;
  char local_140;
  anon_union_4_2_72e6e63f_for_LinearBVHNode_1 aaStack_138 [66];
  
  pLVar10 = this->nodes;
  if (pLVar10 == (LinearBVHNode *)0x0) {
    auVar23 = ZEXT1264(ZEXT412(0));
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0xc0) = auVar23;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x80) = auVar23;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar23;
    *(undefined1 (*) [64])&__return_storage_ptr__->optionalValue = auVar23;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->set = false;
  auVar25._8_4_ = 0x3f800000;
  auVar25._0_8_ = 0x3f8000003f800000;
  auVar25._12_4_ = 0x3f800000;
  local_2e0 = 0;
  lVar17 = 0;
  lVar19 = 0;
  lVar15 = 0;
  uVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar22._4_4_ = uVar4;
  auVar22._0_4_ = uVar2;
  auVar22._8_8_ = 0;
  local_2b8 = *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0);
  uStack_2b0 = *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200);
  local_258 = vdivps_avx(auVar25,auVar22);
  local_2ec = *(float *)((long)&__return_storage_ptr__->optionalValue + 0xf8);
  fVar28 = 1.0 / (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._0_12_ = ZEXT812(0);
  auVar24._12_4_ = 0;
  uVar9 = vcmpps_avx512vl(local_258,auVar24,1);
  auVar22 = vcmpps_avx(local_258,auVar24,1);
  auVar6._8_4_ = 1;
  auVar6._0_8_ = 0x100000001;
  auVar6._12_4_ = 1;
  auVar22 = vandps_avx512vl(auVar22,auVar6);
  lVar21 = 0xc;
  if ((uVar9 & 1) != 0) {
    lVar17 = 0xc;
    lVar21 = local_2e0;
  }
  lVar20 = 0xc;
  if ((uVar9 & 2) != 0) {
    lVar19 = 0xc;
    lVar20 = local_2e0;
  }
  local_268 = vmovlps_avx(auVar22);
  lVar16 = 0xc;
  if (fVar28 < 0.0) {
    lVar15 = 0xc;
    lVar16 = local_2e0;
  }
  iVar14 = 0;
  uVar13 = 0;
  local_260 = (uint)(fVar28 < 0.0);
  local_2d8 = *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48);
  iVar11 = 0;
  do {
    uVar3 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
    uVar5 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
    auVar29._4_4_ = uVar5;
    auVar29._0_4_ = uVar3;
    auVar29._8_8_ = 0;
    fVar1 = (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
LAB_00428be9:
    while( true ) {
      uVar13 = uVar13 + 1;
      auVar22 = vinsertps_avx(ZEXT416(*(uint *)((long)&pLVar10[iVar11].bounds.pMin.
                                                       super_Tuple3<pbrt::Point3,_float>.x + lVar17)
                                     ),ZEXT416(*(uint *)((long)&pLVar10[iVar11].bounds.pMin.
                                                                super_Tuple3<pbrt::Point3,_float>.y
                                                        + lVar19)),0x10);
      auVar22 = vsubps_avx(auVar22,auVar29);
      auVar27._0_4_ = local_258._0_4_ * auVar22._0_4_;
      auVar27._4_4_ = local_258._4_4_ * auVar22._4_4_;
      auVar27._8_4_ = local_258._8_4_ * auVar22._8_4_;
      auVar27._12_4_ = local_258._12_4_ * auVar22._12_4_;
      auVar22 = vinsertps_avx(ZEXT416(*(uint *)((long)&pLVar10[iVar11].bounds.pMin.
                                                       super_Tuple3<pbrt::Point3,_float>.x + lVar21)
                                     ),ZEXT416(*(uint *)((long)&pLVar10[iVar11].bounds.pMin.
                                                                super_Tuple3<pbrt::Point3,_float>.y
                                                        + lVar20)),0x10);
      auVar22 = vsubps_avx(auVar22,auVar29);
      auVar26._0_4_ = local_258._0_4_ * auVar22._0_4_ * 1.0000004;
      auVar26._4_4_ = local_258._4_4_ * auVar22._4_4_ * 1.0000004;
      auVar26._8_4_ = local_258._8_4_ * auVar22._8_4_ * 1.0000004;
      auVar26._12_4_ = local_258._12_4_ * auVar22._12_4_ * 1.0000004;
      auVar22 = vshufps_avx(auVar26,auVar26,0xe1);
      uVar9 = vcmpps_avx512vl(auVar22,auVar27,1);
      if ((uVar9 & 3) == 0) break;
LAB_00428c3d:
      if (iVar14 == 0) goto LAB_00428ebd;
      lVar12 = (long)iVar14;
      iVar14 = iVar14 + -1;
      iVar11 = aaStack_138[lVar12 + -1].primitivesOffset;
    }
    auVar22 = vmovshdup_avx(auVar27);
    auVar22 = vmaxss_avx(auVar22,auVar27);
    fVar7 = fVar28 * (*(float *)((long)&pLVar10[iVar11].bounds.pMin.
                                        super_Tuple3<pbrt::Point3,_float>.z + lVar16) - fVar1) *
            1.0000004;
    if (fVar7 < auVar22._0_4_) goto LAB_00428c3d;
    auVar6 = vmovshdup_avx(auVar26);
    auVar6 = vminss_avx(auVar6,auVar26);
    fVar8 = fVar28 * (*(float *)((long)&pLVar10[iVar11].bounds.pMin.
                                        super_Tuple3<pbrt::Point3,_float>.z + lVar15) - fVar1);
    if (((auVar6._0_4_ < fVar8) ||
        (auVar22 = vmaxss_avx(ZEXT416((uint)fVar8),auVar22), tMax <= auVar22._0_4_)) ||
       (auVar22 = vminss_avx(ZEXT416((uint)fVar7),auVar6), auVar22._0_4_ <= 0.0)) goto LAB_00428c3d;
    if (pLVar10[iVar11].nPrimitives == 0) {
      if (*(int *)((long)&local_268 + (ulong)pLVar10[iVar11].axis * 4) == 0) {
        lVar18 = (long)iVar11;
        lVar12 = (long)iVar14;
        iVar14 = iVar14 + 1;
        iVar11 = iVar11 + 1;
        aaStack_138[lVar12] = pLVar10[lVar18].field_1;
      }
      else {
        lVar12 = (long)iVar14;
        iVar14 = iVar14 + 1;
        aaStack_138[lVar12].primitivesOffset = iVar11 + 1;
        iVar11 = pLVar10[iVar11].field_1.primitivesOffset;
      }
      goto LAB_00428be9;
    }
    lVar12 = 0;
    do {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_240.__align,
                 (this->primitives).
                 super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 pLVar10[iVar11].field_1.primitivesOffset + lVar12,ray,tMax);
      if (local_140 == '\x01') {
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_240._64_8_;
        local_2d8 = local_240._72_8_;
        (__return_storage_ptr__->optionalValue).__align = local_240.__align;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_240._8_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_240._16_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_240._24_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_240._32_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_240._40_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_240._48_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_240._56_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_240._80_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_240._88_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_240._96_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = local_240._104_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_240._112_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = local_240._120_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_240._128_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_240._136_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_240._128_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_240._136_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = local_240._144_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = local_240._152_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = local_240._160_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = local_240._168_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = local_240._176_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_240._184_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_240._240_8_;
        local_2e0 = 1;
        local_2b8 = local_240._192_8_;
        uStack_2b0 = local_240._200_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = local_240._208_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_240._216_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = local_240._224_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_240._232_8_;
        local_2ec = (float)local_240._248_4_;
        tMax = (Float)local_240._248_4_;
      }
      lVar12 = lVar12 + 1;
    } while ((uint)lVar12 < (uint)pLVar10[iVar11].nPrimitives);
    if (iVar14 == 0) {
LAB_00428ebd:
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_2d8;
      *(long *)(in_FS_OFFSET + -0x3f8) = *(long *)(in_FS_OFFSET + -0x3f8) + (ulong)uVar13;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = local_2b8;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = uStack_2b0;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = local_2ec;
      __return_storage_ptr__->set = local_2e0._0_1_;
      return __return_storage_ptr__;
    }
    lVar12 = (long)iVar14;
    iVar14 = iVar14 + -1;
    iVar11 = aaStack_138[lVar12 + -1].primitivesOffset;
    pLVar10 = this->nodes;
  } while( true );
}

Assistant:

pstd::optional<ShapeIntersection> BVHAggregate::Intersect(const Ray &ray,
                                                          Float tMax) const {
    if (nodes == nullptr)
        return {};
    pstd::optional<ShapeIntersection> si;
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    int dirIsNeg[3] = {int(invDir.x < 0), int(invDir.y < 0), int(invDir.z < 0)};
    // Follow ray through BVH nodes to find primitive intersections
    int toVisitOffset = 0, currentNodeIndex = 0;
    int nodesToVisit[64];
    int nodesVisited = 0;
    while (true) {
        ++nodesVisited;
        const LinearBVHNode *node = &nodes[currentNodeIndex];
        // Check ray against BVH node
        if (node->bounds.IntersectP(ray.o, ray.d, tMax, invDir, dirIsNeg)) {
            if (node->nPrimitives > 0) {
                // Intersect ray with primitives in leaf BVH node
                for (int i = 0; i < node->nPrimitives; ++i) {
                    pstd::optional<ShapeIntersection> primSi =
                        primitives[node->primitivesOffset + i].Intersect(ray, tMax);
                    if (primSi) {
                        si = primSi;
                        tMax = si->tHit;
                    }
                }
                if (toVisitOffset == 0)
                    break;
                currentNodeIndex = nodesToVisit[--toVisitOffset];

            } else {
                // Put far BVH node on _nodesToVisit_ stack, advance to near node
                if (dirIsNeg[node->axis]) {
                    nodesToVisit[toVisitOffset++] = currentNodeIndex + 1;
                    currentNodeIndex = node->secondChildOffset;
                } else {
                    nodesToVisit[toVisitOffset++] = node->secondChildOffset;
                    currentNodeIndex = currentNodeIndex + 1;
                }
            }
        } else {
            if (toVisitOffset == 0)
                break;
            currentNodeIndex = nodesToVisit[--toVisitOffset];
        }
    }

    bvhNodesVisited += nodesVisited;
    return si;
}